

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TArray<FKeySection,_FKeySection>::DoDelete
          (TArray<FKeySection,_FKeySection> *this,uint first,uint last)

{
  uint local_1c;
  uint i;
  uint last_local;
  uint first_local;
  TArray<FKeySection,_FKeySection> *this_local;
  
  local_1c = first;
  if (last == 0xffffffff) {
    __assert_fail("last != ~0u",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./tarray.h"
                  ,0x1b2,
                  "void TArray<FKeySection>::DoDelete(unsigned int, unsigned int) [T = FKeySection, TT = FKeySection]"
                 );
  }
  for (; local_1c <= last; local_1c = local_1c + 1) {
    FKeySection::~FKeySection(this->Array + local_1c);
  }
  return;
}

Assistant:

void DoDelete (unsigned int first, unsigned int last)
	{
		assert (last != ~0u);
		for (unsigned int i = first; i <= last; ++i)
		{
			Array[i].~T();
		}
	}